

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Velodyne.h
# Opt level: O2

int ProcessRawDataVelodyne
              (VELODYNE *pVelodyne,u_char *data,uint32_t data_len,double *pDistances,double *pAngles
              ,double *pElevation)

{
  ushort uVar1;
  uint uVar2;
  u_char *puVar3;
  u_char *puVar4;
  int iVar5;
  int j;
  long lVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  
  puVar4 = data + 5;
  uVar7 = 0;
  iVar5 = 0;
  do {
    if (uVar7 == 0xc) {
LAB_00102643:
      return (int)(uVar7 < 0xc);
    }
    if ((ushort)(*(ushort *)(data + uVar7 * 100) << 8 | *(ushort *)(data + uVar7 * 100) >> 8) !=
        0xffee) {
      puts("Error reading data from a Velodyne : Invalid data packet. ");
      goto LAB_00102643;
    }
    uVar1 = *(ushort *)(data + uVar7 * 100 + 2);
    puVar3 = puVar4;
    for (lVar6 = 0; lVar6 != 0x20; lVar6 = lVar6 + 1) {
      uVar2 = (uint)lVar6 & 0xf;
      dVar9 = ((double)*(ushort *)(puVar3 + -1) + (double)*(ushort *)(puVar3 + -1)) / 1000.0;
      if (uVar2 == pVelodyne->DefaultLaserID) {
        dVar8 = fmod_2PI_deg2rad((double)uVar2 * pVelodyne->step_elevation +
                                 pVelodyne->min_elevation);
        *pElevation = dVar8;
        dVar8 = fmod_2PI_pos_deg2rad((double)uVar1 / 100.0);
        pAngles[iVar5] = dVar8;
        if (pVelodyne->bDistanceProjectionWithElevation != 0) {
          dVar8 = cos(*pElevation);
          dVar9 = dVar9 * dVar8;
        }
        pDistances[iVar5] = dVar9;
        iVar5 = iVar5 + 1;
      }
      puVar3 = puVar3 + 3;
    }
    uVar7 = uVar7 + 1;
    puVar4 = puVar4 + 100;
  } while( true );
}

Assistant:

int ProcessRawDataVelodyne(VELODYNE* pVelodyne, const u_char* data, uint32_t data_len, double* pDistances, double* pAngles, double* pElevation)
{
	int k = 0;

	// Assuming buffer contains the received UDP packet.
	unsigned char* dataPacket = (unsigned char*)data;

	// Parse the data packet.
	unsigned char productID = dataPacket[data_len-1];
	unsigned char returnMode = dataPacket[data_len-2];
	unsigned int timeStamp = (dataPacket[data_len-3] << 24) | (dataPacket[data_len-4] << 16) | (dataPacket[data_len-5] << 8) | dataPacket[data_len-6];

	//if (productID != 0x22) {
	//	printf("Error reading data from a Velodyne : Unsupported productID. \n");
	//	return EXIT_FAILURE;
	//}

	int dual_mode = (returnMode == 0x39);
	//if (dual_mode) {
	//	printf("Error reading data from a Velodyne : Unsupported mode. \n");
	//	return EXIT_FAILURE;
	//}

	//memset(pAngles, 0, NB_MEASUREMENTS_VELODYNE);
	//memset(pDistances, 0, NB_MEASUREMENTS_VELODYNE);
	for (int i = 0; i < 12; i++) { // 12 blocks in one data packet.
		unsigned short flag = (dataPacket[i*100] << 8) | dataPacket[i*100 + 1]; // Each block starts with a flag.
		if (flag != 0xFFEE) {
			printf("Error reading data from a Velodyne : Invalid data packet. \n");
			return EXIT_FAILURE;
		}
		unsigned short rawAzimuth = (dataPacket[i*100 + 3] << 8) | dataPacket[i*100 + 2]; // Followed by azimuth data.
		double azimuth = rawAzimuth / 100.0; // Convert to degrees.

		for (int j = 0; j < 32; j++) { // Each block contains 32 data points.
			int dataBlockIndex = (dual_mode)? (i - (i % 2)) + (j / 16): (i * 2) + (j / 16); // From documentation.
			int laserID = j % 16; // There are 16 lasers

			// Assuming firing alternance, symetry...
			double elevation = pVelodyne->min_elevation+(laserID*pVelodyne->step_elevation);

			unsigned short rawDistance = (dataPacket[i*100 + 5 + j*3] << 8) | dataPacket[i*100 + 4 + j*3]; // Distance data.
			//if (rawDistance == 0) // Invalid data.
			//	continue;

			double distance = ((double)rawDistance)*2.0 / 1000.0; // Convert to meters.
			unsigned char intensity = dataPacket[i*100 + 6 + j*3]; // Intensity data.

			double timeOffset = (55.296 * dataBlockIndex) + (2.304 * laserID); // From documentation.

			//std::cout << "Laser ID: " << laserID << "Elevation: " << elevation << ", Azimuth: " << azimuth << ", Distance: " << distance << ", Intensity: " << int(intensity) << ", TimeStamp: " << std::fixed << timeStamp+timeOffset << std::endl;
			

			// TODO: there is a concept of "Vertical Correction" that should be applied...


			if (laserID == pVelodyne->DefaultLaserID)
			{
				*pElevation = fmod_2PI_deg2rad(elevation); // Convert in rad.
				pAngles[k] = fmod_2PI_pos_deg2rad(azimuth); // Convert in rad.
				if (pVelodyne->bDistanceProjectionWithElevation)
				{
					pDistances[k] = distance*cos(*pElevation); // Convert in m.
				}
				else 
				{
					pDistances[k] = distance; // Convert in m.
				}
				k++;
			}
			UNREFERENCED_PARAMETER(intensity);
			UNREFERENCED_PARAMETER(timeOffset);
		}
	}

	UNREFERENCED_PARAMETER(timeStamp);
	UNREFERENCED_PARAMETER(productID);

	return EXIT_SUCCESS;	
}